

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalyticSolution.cpp
# Opt level: O3

void __thiscall
TStokesAnalytic::Duxy<Fad<double>>
          (TStokesAnalytic *this,TPZVec<Fad<double>_> *x,TPZFMatrix<Fad<double>_> *Du)

{
  long lVar1;
  int i;
  long lVar2;
  int j;
  long lVar3;
  TPZFMatrix<Fad<double>_> gradT;
  TPZFMatrix<Fad<double>_> grad;
  FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> local_180;
  undefined1 local_170 [8];
  undefined8 local_168;
  double *pdStack_160;
  FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *pFStack_158;
  undefined1 local_150 [32];
  Fad<double> *local_130;
  TPZFMatrix<Fad<double>_> local_c0;
  
  local_150._0_8_ = (_func_int **)0x0;
  local_150._8_4_ = 0;
  local_150._16_8_ = (double *)0x0;
  local_150._24_8_ = 0.0;
  TPZFMatrix<Fad<double>_>::TPZFMatrix(&local_c0,3,3,(Fad<double> *)local_150);
  Fad<double>::~Fad((Fad<double> *)local_150);
  local_170 = (undefined1  [8])0x0;
  local_168 = (double)((ulong)local_168._4_4_ << 0x20);
  pdStack_160 = (double *)0x0;
  pFStack_158 = (FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)0x0;
  TPZFMatrix<Fad<double>_>::TPZFMatrix
            ((TPZFMatrix<Fad<double>_> *)local_150,3,3,(Fad<double> *)local_170);
  Fad<double>::~Fad((Fad<double> *)local_170);
  graduxy<Fad<double>>(this,x,&local_c0);
  TPZFMatrix<Fad<double>_>::Transpose(&local_c0,(TPZMatrix<Fad<double>_> *)local_150);
  lVar2 = 0;
  do {
    lVar3 = 0;
    do {
      if ((local_c0.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow <= lVar2) ||
         (local_c0.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fCol <= lVar3)) {
        TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if ((CONCAT44(local_150._12_4_,local_150._8_4_) <= lVar2) || ((long)local_150._16_8_ <= lVar3)
         ) {
        TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      local_180.fadexpr_.left_ =
           local_c0.fElem +
           local_c0.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow * lVar3 + lVar2;
      local_180.fadexpr_.right_ =
           local_130 + CONCAT44(local_150._12_4_,local_150._8_4_) * lVar3 + lVar2;
      local_168 = 0.5;
      pdStack_160 = (double *)0x0;
      pFStack_158 = &local_180;
      lVar1 = (Du->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
      if ((lVar1 <= lVar2) ||
         ((Du->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol <= lVar3)) {
        TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      Fad<double>::operator=
                (Du->fElem + lVar1 * lVar3 + lVar2,
                 (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>
                  *)local_170);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    lVar2 = lVar2 + 1;
    if (lVar2 == 3) {
      TPZFMatrix<Fad<double>_>::~TPZFMatrix((TPZFMatrix<Fad<double>_> *)local_150);
      TPZFMatrix<Fad<double>_>::~TPZFMatrix(&local_c0);
      return;
    }
  } while( true );
}

Assistant:

void TStokesAnalytic::Duxy(const TPZVec<TVar> &x, TPZFMatrix<TVar> &Du) const
{
    TPZFMatrix<TVar> grad(3,3,0.), gradT(3,3,0.);
    graduxy(x,grad);
    grad.Transpose(&gradT);
    for(int i=0; i<3; i++)
    {
        for(int j=0; j<3; j++)
        {
            Du(i,j) = 0.5*(grad(i,j)+gradT(i,j));
        }
    }
}